

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::percolateDown
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  bool bVar1;
  int iVar2;
  Size SVar3;
  int *piVar4;
  Size in_ESI;
  vec<int,_int> *in_RDI;
  int child;
  int x;
  int in_stack_ffffffffffffff9c;
  int k;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  vec<int,_int> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Size local_3c;
  int local_c;
  
  piVar4 = vec<int,_int>::operator[](in_RDI,in_ESI);
  k = *piVar4;
  local_c = in_ESI;
  while( true ) {
    iVar2 = left(local_c);
    SVar3 = vec<int,_int>::size(in_RDI);
    if (SVar3 <= iVar2) break;
    iVar2 = right(local_c);
    SVar3 = vec<int,_int>::size(in_RDI);
    if (iVar2 < SVar3) {
      iVar2 = right(local_c);
      vec<int,_int>::operator[](in_RDI,iVar2);
      iVar2 = left(local_c);
      vec<int,_int>::operator[](in_RDI,iVar2);
      bVar1 = SimpSolver::ElimLt::operator()
                        ((ElimLt *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (Var_conflict)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                         (Var_conflict)in_stack_ffffffffffffffa8);
      if (!bVar1) goto LAB_00a45a5f;
      local_3c = right(local_c);
    }
    else {
LAB_00a45a5f:
      local_3c = left(local_c);
    }
    vec<int,_int>::operator[](in_RDI,local_3c);
    bVar1 = SimpSolver::ElimLt::operator()
                      ((ElimLt *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (Var_conflict)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                       (Var_conflict)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    piVar4 = vec<int,_int>::operator[](in_RDI,local_3c);
    in_stack_ffffffffffffffa4 = *piVar4;
    piVar4 = vec<int,_int>::operator[](in_RDI,local_c);
    *piVar4 = in_stack_ffffffffffffffa4;
    in_stack_ffffffffffffffa8 = in_RDI + 1;
    vec<int,_int>::operator[](in_RDI,local_c);
    in_stack_ffffffffffffffb4 = local_c;
    piVar4 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[]
                       ((IntMap<int,_int,_Minisat::MkIndexDefault<int>_> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    *piVar4 = in_stack_ffffffffffffffb4;
    local_c = local_3c;
  }
  piVar4 = vec<int,_int>::operator[](in_RDI,local_c);
  *piVar4 = k;
  piVar4 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[]
                     ((IntMap<int,_int,_Minisat::MkIndexDefault<int>_> *)
                      CONCAT44(in_stack_ffffffffffffffa4,local_c),k);
  *piVar4 = local_c;
  return;
}

Assistant:

void percolateDown(int i)
    {
        K x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }